

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O2

void __thiscall
libtorrent::upnp::on_upnp_xml
          (upnp *this,error_code *e,http_parser *p,rootdevice *d,http_connection *c)

{
  shared_ptr<libtorrent::aux::http_connection> *this_00;
  int *piVar1;
  http_connection *phVar2;
  resolver *__args_1;
  string *this_01;
  bool bVar3;
  int iVar4;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *callback;
  _Alloc_hider ec_00;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar6;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  string_view input;
  span<const_char> sVar7;
  string_view url;
  string_view url_00;
  undefined1 local_2a1;
  string *local_2a0;
  error_code ec;
  undefined1 local_288 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_280 [2];
  string *local_270;
  string protocol;
  _Any_data local_248;
  undefined8 local_238;
  undefined8 uStack_230;
  _Any_data local_228;
  undefined8 local_218;
  undefined8 uStack_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  shared_ptr<libtorrent::upnp> me;
  undefined1 local_1d8 [136];
  code *local_150 [2];
  rootdevice *local_140;
  string *local_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_130;
  string auth;
  parse_state s;
  string *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  context *local_58;
  _Function_base local_50;
  
  ec_00._M_p = (pointer)c;
  ::std::__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::upnp,void>
            ((__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2> *)&me,
             (__weak_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2> *)this);
  this_00 = &d->upnp_connection;
  phVar2 = (d->upnp_connection).
           super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar5 = extraout_XMM0_Da;
  uVar6 = extraout_XMM0_Db;
  if (phVar2 == c) {
    aux::http_connection::close(phVar2,0);
    ::std::__shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>::reset
              (&this_00->
                super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>);
    uVar5 = extraout_XMM0_Da_00;
    uVar6 = extraout_XMM0_Db_00;
  }
  if (this->m_closing != false) goto LAB_0033271f;
  if (e->failed_ == true) {
    s._0_16_ = boost::asio::error::make_error_code(eof);
    bVar3 = boost::system::operator!=(e,(error_code *)&s);
    uVar5 = extraout_XMM0_Da_01;
    uVar6 = extraout_XMM0_Db_01;
    if (!bVar3) goto LAB_0033252a;
    iVar4 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
    if ((char)iVar4 != '\0') {
      (*e->cat_->_vptr_error_category[4])(&s,e->cat_,(ulong)(uint)e->val_);
      log(this,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
      ::std::__cxx11::string::~string((string *)&s);
    }
  }
  else {
LAB_0033252a:
    if (p->m_state == read_body) {
      if (p->m_status_code == 200) {
        s.control_url._M_dataplus._M_p = (pointer)&s.control_url.field_2;
        s._0_8_ = s._1_8_ << 8;
        s.tag_stack.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        s.tag_stack.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        s.tag_stack.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        s.control_url._M_string_length = 0;
        s.control_url.field_2._M_local_buf[0] = '\0';
        s.service_type._M_dataplus._M_p = (pointer)&s.service_type.field_2;
        s.service_type._M_string_length = 0;
        s.service_type.field_2._M_local_buf[0] = '\0';
        s.model._M_dataplus._M_p = (pointer)&s.model.field_2;
        s.model._M_string_length = 0;
        s.model.field_2._M_local_buf[0] = '\0';
        callback = (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)&s.url_base.field_2;
        s.url_base._M_string_length = 0;
        s.url_base.field_2._M_local_buf[0] = '\0';
        s.url_base._M_dataplus._M_p = (pointer)callback;
        sVar7 = aux::http_parser::get_body(p);
        local_1d8._0_8_ = find_control_url;
        local_1d8._8_8_ = &s;
        ::std::
        function<void(int,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
        ::
        function<std::_Bind<void(*(std::_Placeholder<1>,std::_Placeholder<2>,std::reference_wrapper<libtorrent::parse_state>))(int,std::basic_string_view<char,std::char_traits<char>>,libtorrent::parse_state&)>,void>
                  ((function<void(int,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
                    *)&local_50,
                   (_Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_std::reference_wrapper<libtorrent::parse_state>))(int,_std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::parse_state_&)>
                    *)local_1d8);
        input._M_str = (char *)&local_50;
        input._M_len = (size_t)sVar7.m_ptr;
        aux::xml_parse((aux *)sVar7.m_len,input,callback);
        ::std::_Function_base::~_Function_base(&local_50);
        if (s.control_url._M_string_length == 0) {
          log(this,(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
          d->disabled = true;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)&d->service_namespace);
          if (s.model._M_string_length != 0) {
            ::std::__cxx11::string::_M_assign((string *)&this->m_model);
          }
          if (s.url_base._M_string_length == 0) {
LAB_0033276a:
            ::std::__cxx11::string::_M_assign((string *)&d->control_url);
          }
          else {
            ::std::__cxx11::string::substr((ulong)local_1d8,(ulong)&s.control_url);
            bVar3 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_1d8,"http://");
            ::std::__cxx11::string::~string((string *)local_1d8);
            if (!bVar3) goto LAB_0033276a;
            if (((s.url_base._M_dataplus._M_p[s.url_base._M_string_length - 1] == '/') &&
                (s.control_url._M_string_length != 0)) && (*s.control_url._M_dataplus._M_p == '/'))
            {
              ::std::__cxx11::string::erase
                        (&s.url_base,s.url_base._M_dataplus._M_p + (s.url_base._M_string_length - 1)
                        );
            }
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1d8,&s.url_base,&s.control_url);
            ::std::__cxx11::string::operator=((string *)&d->control_url,(string *)local_1d8);
            ::std::__cxx11::string::~string((string *)local_1d8);
          }
          protocol._M_dataplus._M_p = (pointer)&protocol.field_2;
          protocol._M_string_length = 0;
          auth._M_dataplus._M_p = (pointer)&auth.field_2;
          auth._M_string_length = 0;
          protocol.field_2._M_local_buf[0] = '\0';
          ec.val_ = 0;
          auth.field_2._M_local_buf[0] = '\0';
          ec.failed_ = false;
          ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                     super_error_category;
          if (((d->control_url)._M_string_length != 0) &&
             (*(d->control_url)._M_dataplus._M_p == '/')) {
            url._M_str = (char *)&ec;
            url._M_len = (size_t)(d->url)._M_dataplus._M_p;
            local_2a0 = (string *)&d->control_url;
            aux::parse_url_components_abi_cxx11_
                      ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_1d8,(aux *)(d->url)._M_string_length,url,(error_code *)ec_00._M_p);
            piVar1 = &d->port;
            local_150[0] = (code *)&d->path;
            local_138 = &auth;
            _Stack_130._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&protocol;
            local_150[1] = (code *)piVar1;
            local_140 = (rootdevice *)&d->hostname;
            ::std::
            tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
            ::operator=((tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
                         *)local_150,
                        (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_1d8);
            ::std::
            _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_1d8);
            if (d->port == -1) {
              bVar3 = ::std::operator==(&protocol,"http");
              iVar4 = 0x1bb;
              if (bVar3) {
                iVar4 = 0x50;
              }
              *piVar1 = iVar4;
            }
            ::std::operator+(&local_208,&protocol,"://");
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_248,&local_208,&d->hostname);
            this_01 = local_2a0;
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_228,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_248,":");
            aux::to_string((array<char,_22UL> *)local_288,(long)*piVar1);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_150,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_228,local_288);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1d8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_150,&s.control_url);
            ::std::__cxx11::string::operator=(this_01,(string *)local_1d8);
            ::std::__cxx11::string::~string((string *)local_1d8);
            ::std::__cxx11::string::~string((string *)local_150);
            ::std::__cxx11::string::~string((string *)local_228._M_pod_data);
            ::std::__cxx11::string::~string((string *)local_248._M_pod_data);
            ::std::__cxx11::string::~string((string *)&local_208);
          }
          iVar4 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
          if ((char)iVar4 != '\0') {
            ec_00 = s.url_base._M_dataplus;
            log(this,(double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
          }
          url_00._M_str = (char *)&ec;
          url_00._M_len = (size_t)(d->control_url)._M_dataplus._M_p;
          aux::parse_url_components_abi_cxx11_
                    ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_1d8,(aux *)(d->control_url)._M_string_length,url_00,
                     (error_code *)ec_00._M_p);
          local_270 = &d->hostname;
          local_2a0 = (string *)&d->port;
          local_150[0] = (code *)&d->path;
          local_138 = &auth;
          _Stack_130._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&protocol;
          local_150[1] = (code *)local_2a0;
          local_140 = (rootdevice *)local_270;
          ::std::
          tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
          ::operator=((tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
                       *)local_150,
                      (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_1d8);
          ::std::
          _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_1d8);
          if (d->port == -1) {
            bVar3 = ::std::operator==(&protocol,"http");
            iVar4 = 0x1bb;
            if (bVar3) {
              iVar4 = 0x50;
            }
            *(int *)local_2a0 = iVar4;
          }
          if (ec.failed_ == true) {
            iVar4 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
            if ((char)iVar4 != '\0') {
              (*(ec.cat_)->_vptr_error_category[4])(local_1d8,ec.cat_,(ulong)(uint)ec.val_);
              log(this,(double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
              ::std::__cxx11::string::~string((string *)local_1d8);
            }
            d->disabled = true;
          }
          else {
            phVar2 = (this_00->
                     super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
            if (phVar2 != (http_connection *)0x0) {
              aux::http_connection::close(phVar2,0);
            }
            __args_1 = (resolver *)this->m_io_service;
            ::std::__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<libtorrent::upnp,void>
                      ((__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2> *)local_288,
                       (__weak_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2> *)this);
            local_1d8._0_8_ = on_upnp_get_ip_address_response;
            local_1d8._8_8_ = (parse_state *)0x0;
            local_1d8._24_8_ = local_288;
            local_1d8._32_8_ = a_Stack_280[0]._M_pi;
            local_288[0] = '\0';
            local_288[1] = '\0';
            local_288[2] = '\0';
            local_288[3] = '\0';
            local_288[4] = '\0';
            local_288[5] = '\0';
            local_288[6] = '\0';
            local_288[7] = '\0';
            a_Stack_280[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_2a1 = 1;
            local_1d8._16_8_ = d;
            ::std::__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<libtorrent::upnp,void>
                      ((__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2> *)&local_68,
                       (__weak_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2> *)this);
            local_150[0] = get_ip_address;
            local_150[1] = (code *)0x0;
            local_138 = local_68;
            _Stack_130._M_pi = _Stack_60._M_pi;
            local_68 = (string *)0x0;
            _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_218 = 0;
            uStack_210 = 0;
            local_228._M_unused._M_object = (void *)0x0;
            local_228._8_8_ = 0;
            local_238 = 0;
            uStack_230 = 0;
            local_248._M_unused._M_object = (void *)0x0;
            local_248._8_8_ = 0;
            local_58 = &this->m_ssl_ctx;
            local_140 = d;
            ::std::
            make_shared<libtorrent::aux::http_connection,boost::asio::io_context&,libtorrent::aux::resolver&,std::_Bind<void(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,std::_Placeholder<1>,std::_Placeholder<2>,std::reference_wrapper<libtorrent::upnp::rootdevice>,std::_Placeholder<4>))(boost::system::error_code_const&,libtorrent::aux::http_parser_const&,libtorrent::upnp::rootdevice&,libtorrent::aux::http_connection&)>,bool,int_const&,std::_Bind<void(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,std::reference_wrapper<libtorrent::upnp::rootdevice>))(libtorrent::upnp::rootdevice&)>,std::function<void(libtorrent::aux::http_connection&,std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>&)>,std::function<bool(libtorrent::aux::http_connection&,std::basic_string_view<char,std::char_traits<char>>)>,boost::asio::ssl::context*>
                      ((io_context *)&local_208,__args_1,
                       (_Bind<void_(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::reference_wrapper<libtorrent::upnp::rootdevice>,_std::_Placeholder<4>))(const_boost::system::error_code_&,_const_libtorrent::aux::http_parser_&,_libtorrent::upnp::rootdevice_&,_libtorrent::aux::http_connection_&)>
                        *)&this->m_resolver,(bool *)local_1d8,(int *)&local_2a1,
                       (_Bind<void_(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,_std::reference_wrapper<libtorrent::upnp::rootdevice>))(libtorrent::upnp::rootdevice_&)>
                        *)&aux::default_max_bottled_buffer_size,
                       (function<void_(libtorrent::aux::http_connection_&,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
                        *)local_150,
                       (function<bool_(libtorrent::aux::http_connection_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
                        *)&local_228,(context **)&local_248);
            ::std::__shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>::
            operator=(&this_00->
                       super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                      ,(__shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2> *
                       )&local_208);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_208._M_string_length);
            ::std::_Function_base::~_Function_base((_Function_base *)&local_248);
            ::std::_Function_base::~_Function_base((_Function_base *)&local_228);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_130);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_60);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d8 + 0x20));
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_280);
            local_1d8[0x40] = '\0';
            aux::http_connection::start
                      ((this_00->
                       super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr,local_270,*(int *)local_2a0,(time_duration)0x2540be400,
                       (proxy_settings *)0x0,false,5,
                       (optional<libtorrent::aux::bind_info_t> *)local_1d8,(resolver_flags)0x0,
                       (i2p_connection *)0x0);
            ::std::_Optional_payload_base<libtorrent::aux::bind_info_t>::_M_reset
                      ((_Optional_payload_base<libtorrent::aux::bind_info_t> *)local_1d8);
          }
          ::std::__cxx11::string::~string((string *)&auth);
          ::std::__cxx11::string::~string((string *)&protocol);
        }
        parse_state::~parse_state(&s);
        goto LAB_0033271f;
      }
      iVar4 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
      if ((char)iVar4 != '\0') {
        log(this,(double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
      }
    }
    else {
      log(this,(double)CONCAT44(uVar6,uVar5));
    }
  }
  d->disabled = true;
LAB_0033271f:
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&me.super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void upnp::on_upnp_xml(error_code const& e
	, aux::http_parser const& p, rootdevice& d
	, aux::http_connection& c)
{
	TORRENT_ASSERT(is_single_thread());
	std::shared_ptr<upnp> me(self());

	TORRENT_ASSERT(d.magic == 1337);
	if (d.upnp_connection && d.upnp_connection.get() == &c)
	{
		d.upnp_connection->close();
		d.upnp_connection.reset();
	}

	if (m_closing) return;

	if (e && e != boost::asio::error::eof)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("error while fetching control url from: %s: %s"
				, d.url.c_str(), e.message().c_str());
		}
#endif
		d.disabled = true;
		return;
	}

	if (!p.header_finished())
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("error while fetching control url from: %s: incomplete HTTP message"
			, d.url.c_str());
#endif
		d.disabled = true;
		return;
	}

	if (p.status_code() != 200)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("error while fetching control url from: %s: %s"
				, d.url.c_str(), p.message().c_str());
		}
#endif
		d.disabled = true;
		return;
	}

	parse_state s;
	auto body = p.get_body();
	xml_parse({body.data(), std::size_t(body.size())}, std::bind(&find_control_url, _1, _2, std::ref(s)));
	if (s.control_url.empty())
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("could not find a port mapping interface in response from: %s"
			, d.url.c_str());
#endif
		d.disabled = true;
		return;
	}
	d.service_namespace = s.service_type;

	TORRENT_ASSERT(!d.service_namespace.empty());

	if (!s.model.empty()) m_model = s.model;

	if (!s.url_base.empty() && s.control_url.substr(0, 7) != "http://")
	{
		// avoid double slashes in path
		if (s.url_base[s.url_base.size()-1] == '/'
			&& !s.control_url.empty()
			&& s.control_url[0] == '/')
			s.url_base.erase(s.url_base.end()-1);
		d.control_url = s.url_base + s.control_url;
	}
	else d.control_url = s.control_url;

	std::string protocol;
	std::string auth;
	error_code ec;
	if (!d.control_url.empty() && d.control_url[0] == '/')
	{
		std::tie(protocol, auth, d.hostname, d.port, d.path)
			= parse_url_components(d.url, ec);
		if (d.port == -1) d.port = protocol == "http" ? 80 : 443;
		d.control_url = protocol + "://" + d.hostname + ":"
			+ to_string(d.port).data() + s.control_url;
	}

#ifndef TORRENT_DISABLE_LOGGING
	if (should_log())
	{
		log("found control URL: %s namespace %s "
			"urlbase: %s in response from %s"
			, d.control_url.c_str(), d.service_namespace.c_str()
			, s.url_base.c_str(), d.url.c_str());
	}
#endif

	std::tie(protocol, auth, d.hostname, d.port, d.path)
		= parse_url_components(d.control_url, ec);
	if (d.port == -1) d.port = protocol == "http" ? 80 : 443;

	if (ec)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("failed to parse URL '%s': %s"
				, d.control_url.c_str(), ec.message().c_str());
		}
#endif
		d.disabled = true;
		return;
	}

	if (d.upnp_connection) d.upnp_connection->close();
	d.upnp_connection = std::make_shared<http_connection>(m_io_service
		, m_resolver
		, std::bind(&upnp::on_upnp_get_ip_address_response, self(), _1, _2
			, std::ref(d), _4), true, default_max_bottled_buffer_size
		, std::bind(&upnp::get_ip_address, self(), std::ref(d))
		, http_filter_handler()
		, hostname_filter_handler()
#if TORRENT_USE_SSL
		, &m_ssl_ctx
#endif
		);
	d.upnp_connection->start(d.hostname, d.port, seconds(10));
}